

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement_type.cpp
# Opt level: O0

string * duckdb::StatementTypeToString_abi_cxx11_(StatementType type)

{
  undefined1 in_SIL;
  string *in_RDI;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [19];
  allocator local_a [10];
  
  switch(in_SIL) {
  case 0:
  default:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"INVALID",&local_39);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case 1:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"SELECT",local_a);
    ::std::allocator<char>::~allocator((allocator<char> *)local_a);
    break;
  case 2:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"INSERT",local_1d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 3:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"UPDATE",&local_1e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 4:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE",&local_2a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 5:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"DELETE",&local_1f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 6:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"PREPARE",&local_20);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 7:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EXECUTE",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 8:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"ALTER",&local_22);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 9:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"TRANSACTION",&local_23);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  case 10:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"COPY",&local_24);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_24);
    break;
  case 0xb:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"ANALYZE",&local_26);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 0xc:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"VARIABLE_SET",&local_27);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 0xd:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE_FUNC",&local_28);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 0xe:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EXPLAIN",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 0xf:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"DROP",&local_2b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 0x10:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EXPORT",&local_2f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 0x11:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"PRAGMA",&local_2c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 0x12:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"VACUUM",&local_2d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case 0x13:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CALL",&local_30);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 0x14:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"SET",&local_31);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case 0x15:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"LOAD",&local_32);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case 0x16:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"RELATION",&local_2e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 0x17:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EXTENSION",&local_33);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 0x18:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"LOGICAL_PLAN",&local_34);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case 0x19:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"ATTACH",&local_35);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case 0x1a:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"DETACH",&local_36);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 0x1b:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"MULTI",&local_37);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case 0x1c:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"COPY_DATABASE",&local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_25);
    break;
  case 0x1d:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"UPDATE_EXTENSIONS",&local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_38);
  }
  return in_RDI;
}

Assistant:

string StatementTypeToString(StatementType type) {
	switch (type) {
	case StatementType::SELECT_STATEMENT:
		return "SELECT";
	case StatementType::INSERT_STATEMENT:
		return "INSERT";
	case StatementType::UPDATE_STATEMENT:
		return "UPDATE";
	case StatementType::DELETE_STATEMENT:
		return "DELETE";
	case StatementType::PREPARE_STATEMENT:
		return "PREPARE";
	case StatementType::EXECUTE_STATEMENT:
		return "EXECUTE";
	case StatementType::ALTER_STATEMENT:
		return "ALTER";
	case StatementType::TRANSACTION_STATEMENT:
		return "TRANSACTION";
	case StatementType::COPY_STATEMENT:
		return "COPY";
	case StatementType::COPY_DATABASE_STATEMENT:
		return "COPY_DATABASE";
	case StatementType::ANALYZE_STATEMENT:
		return "ANALYZE";
	case StatementType::VARIABLE_SET_STATEMENT:
		return "VARIABLE_SET";
	case StatementType::CREATE_FUNC_STATEMENT:
		return "CREATE_FUNC";
	case StatementType::EXPLAIN_STATEMENT:
		return "EXPLAIN";
	case StatementType::CREATE_STATEMENT:
		return "CREATE";
	case StatementType::DROP_STATEMENT:
		return "DROP";
	case StatementType::PRAGMA_STATEMENT:
		return "PRAGMA";
	case StatementType::VACUUM_STATEMENT:
		return "VACUUM";
	case StatementType::RELATION_STATEMENT:
		return "RELATION";
	case StatementType::EXPORT_STATEMENT:
		return "EXPORT";
	case StatementType::CALL_STATEMENT:
		return "CALL";
	case StatementType::SET_STATEMENT:
		return "SET";
	case StatementType::LOAD_STATEMENT:
		return "LOAD";
	case StatementType::EXTENSION_STATEMENT:
		return "EXTENSION";
	case StatementType::LOGICAL_PLAN_STATEMENT:
		return "LOGICAL_PLAN";
	case StatementType::ATTACH_STATEMENT:
		return "ATTACH";
	case StatementType::DETACH_STATEMENT:
		return "DETACH";
	case StatementType::MULTI_STATEMENT:
		return "MULTI";
	case StatementType::UPDATE_EXTENSIONS_STATEMENT:
		return "UPDATE_EXTENSIONS";
	case StatementType::INVALID_STATEMENT:
		break;
	}
	return "INVALID";
}